

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::BitState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::BitOrOperation>
               (hugeint_t *idata,AggregateInputData *aggr_input_data,
               BitState<duckdb::hugeint_t> **states,ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  idx_t iVar2;
  idx_t iVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  AggregateUnaryInput local_60;
  ulong local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  local_60.input = aggr_input_data;
  local_60.input_mask = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    local_60.input_idx = 0;
    if (count != 0) {
      do {
        BitwiseOperation::
        Operation<duckdb::hugeint_t,duckdb::BitState<duckdb::hugeint_t>,duckdb::BitOrOperation>
                  (states[local_60.input_idx],idata + local_60.input_idx,&local_60);
        local_60.input_idx = local_60.input_idx + 1;
      } while (local_60.input_idx < count);
    }
  }
  else {
    local_60.input_idx = 0;
    if (0x3f < count + 0x3f) {
      local_48 = count + 0x3f >> 6;
      uVar5 = 0;
      local_40 = mask;
      local_38 = count;
      do {
        iVar2 = local_60.input_idx;
        puVar1 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar4 = 0xffffffffffffffff;
        }
        else {
          uVar4 = puVar1[uVar5];
        }
        uVar6 = local_60.input_idx + 0x40;
        if (local_38 <= local_60.input_idx + 0x40) {
          uVar6 = local_38;
        }
        iVar3 = uVar6;
        if (uVar4 != 0) {
          if (uVar4 == 0xffffffffffffffff) {
            for (; iVar3 = local_60.input_idx, local_60.input_idx < uVar6;
                local_60.input_idx = local_60.input_idx + 1) {
              BitwiseOperation::
              Operation<duckdb::hugeint_t,duckdb::BitState<duckdb::hugeint_t>,duckdb::BitOrOperation>
                        (states[local_60.input_idx],idata + local_60.input_idx,&local_60);
            }
          }
          else {
            for (; iVar3 = local_60.input_idx, local_60.input_idx < uVar6;
                local_60.input_idx = local_60.input_idx + 1) {
              if ((uVar4 >> ((ulong)(uint)((int)local_60.input_idx - (int)iVar2) & 0x3f) & 1) != 0)
              {
                BitwiseOperation::
                Operation<duckdb::hugeint_t,duckdb::BitState<duckdb::hugeint_t>,duckdb::BitOrOperation>
                          (states[local_60.input_idx],idata + local_60.input_idx,&local_60);
              }
            }
          }
        }
        local_60.input_idx = iVar3;
        uVar5 = uVar5 + 1;
      } while (uVar5 != local_48);
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}